

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufFromBuffer(xmlBufferPtr buffer)

{
  xmlChar *pxVar1;
  xmlBufPtr ret;
  xmlBufferPtr buffer_local;
  
  if (buffer == (xmlBufferPtr)0x0) {
    buffer_local = (xmlBufferPtr)0x0;
  }
  else {
    buffer_local = (xmlBufferPtr)(*xmlMalloc)(0x38);
    if ((xmlBufPtr)buffer_local == (xmlBufPtr)0x0) {
      buffer_local = (xmlBufferPtr)0x0;
    }
    else {
      ((xmlBufPtr)buffer_local)->use = (ulong)buffer->use;
      ((xmlBufPtr)buffer_local)->flags = 0;
      ((xmlBufPtr)buffer_local)->maxSize = 0xfffffffffffffffe;
      if (buffer->content == (xmlChar *)0x0) {
        ((xmlBufPtr)buffer_local)->size = 0x32;
        pxVar1 = (xmlChar *)(*xmlMalloc)(((xmlBufPtr)buffer_local)->size + 1);
        ((xmlBufPtr)buffer_local)->mem = pxVar1;
        ((xmlBufPtr)buffer_local)->content = ((xmlBufPtr)buffer_local)->mem;
        if (((xmlBufPtr)buffer_local)->mem == (xmlChar *)0x0) {
          xmlBufMemoryError((xmlBufPtr)buffer_local);
        }
        else {
          *((xmlBufPtr)buffer_local)->content = '\0';
        }
      }
      else {
        ((xmlBufPtr)buffer_local)->size = (ulong)(buffer->size - 1);
        ((xmlBufPtr)buffer_local)->content = buffer->content;
        if (buffer->alloc == XML_BUFFER_ALLOC_IO) {
          ((xmlBufPtr)buffer_local)->mem = buffer->contentIO;
        }
        else {
          ((xmlBufPtr)buffer_local)->mem = buffer->content;
        }
      }
      if (((xmlBufPtr)buffer_local)->size < 0x7fffffff) {
        ((xmlBufPtr)buffer_local)->compat_size = (uint)((xmlBufPtr)buffer_local)->size;
      }
      else {
        ((xmlBufPtr)buffer_local)->compat_size = 0x7fffffff;
      }
      if (((xmlBufPtr)buffer_local)->use < 0x7fffffff) {
        ((xmlBufPtr)buffer_local)->compat_use = (uint)((xmlBufPtr)buffer_local)->use;
      }
      else {
        ((xmlBufPtr)buffer_local)->compat_use = 0x7fffffff;
      }
    }
  }
  return (xmlBufPtr)buffer_local;
}

Assistant:

xmlBufPtr
xmlBufFromBuffer(xmlBufferPtr buffer) {
    xmlBufPtr ret;

    if (buffer == NULL)
        return(NULL);

    ret = xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL)
        return(NULL);

    ret->use = buffer->use;
    ret->flags = 0;
    ret->maxSize = SIZE_MAX - 1;

    if (buffer->content == NULL) {
        ret->size = 50;
        ret->mem = xmlMalloc(ret->size + 1);
        ret->content = ret->mem;
        if (ret->mem == NULL)
            xmlBufMemoryError(ret);
        else
            ret->content[0] = 0;
    } else {
        ret->size = buffer->size - 1;
        ret->content = buffer->content;
        if (buffer->alloc == XML_BUFFER_ALLOC_IO)
            ret->mem = buffer->contentIO;
        else
            ret->mem = buffer->content;
    }

    UPDATE_COMPAT(ret);
    return(ret);
}